

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O1

uint __thiscall Assimp::XFileParser::ReadInt(XFileParser *this)

{
  char cVar1;
  unsigned_short uVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  string local_40;
  
  if (this->mIsBinaryFormat == true) {
    if ((this->mBinaryNumCount == 0) && (1 < (long)this->mEnd - (long)this->mP)) {
      uVar2 = ReadBinWord(this);
      uVar3 = 1;
      if ((uVar2 == 6) && (3 < (long)this->mEnd - (long)this->mP)) {
        uVar3 = ReadBinDWord(this);
      }
      this->mBinaryNumCount = uVar3;
    }
    this->mBinaryNumCount = this->mBinaryNumCount - 1;
    if (3 < (ulong)((long)this->mEnd - (long)this->mP)) {
      uVar3 = ReadBinDWord(this);
      return uVar3;
    }
    this->mP = this->mEnd;
    uVar4 = 0;
  }
  else {
    FindNextNoneWhiteSpace(this);
    cVar1 = *this->mP;
    if (cVar1 == '-') {
      this->mP = this->mP + 1;
    }
    if (9 < (int)*this->mP - 0x30U) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Number expected.","");
      ThrowException(this,&local_40);
    }
    pcVar5 = this->mP;
    uVar3 = 0;
    if (pcVar5 < this->mEnd) {
      uVar3 = 0;
      do {
        if (9 < (int)*pcVar5 - 0x30U) break;
        uVar3 = ((int)*pcVar5 - 0x30U) + uVar3 * 10;
        pcVar5 = pcVar5 + 1;
        this->mP = pcVar5;
      } while (pcVar5 != this->mEnd);
    }
    CheckForSeparator(this);
    uVar4 = -uVar3;
    if (cVar1 != '-') {
      uVar4 = uVar3;
    }
  }
  return uVar4;
}

Assistant:

unsigned int XFileParser::ReadInt()
{
   if( mIsBinaryFormat)
    {
        if( mBinaryNumCount == 0 && mEnd - mP >= 2)
        {
            unsigned short tmp = ReadBinWord(); // 0x06 or 0x03
            if( tmp == 0x06 && mEnd - mP >= 4) // array of ints follows
                mBinaryNumCount = ReadBinDWord();
            else // single int follows
                mBinaryNumCount = 1;
        }

        --mBinaryNumCount;
        const size_t len( mEnd - mP );
        if ( len >= 4) {
            return ReadBinDWord();
        } else {
            mP = mEnd;
            return 0;
        }
    } else
    {
        FindNextNoneWhiteSpace();

        // TODO: consider using strtol10 instead???

        // check preceding minus sign
        bool isNegative = false;
        if( *mP == '-')
        {
            isNegative = true;
            mP++;
        }

        // at least one digit expected
        if( !isdigit( *mP))
            ThrowException( "Number expected.");

        // read digits
        unsigned int number = 0;
        while( mP < mEnd)
        {
            if( !isdigit( *mP))
                break;
            number = number * 10 + (*mP - 48);
            mP++;
        }

        CheckForSeparator();

        return isNegative ? ((unsigned int) -int( number)) : number;
    }
}